

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O0

string * __thiscall
Chart::renderMonth_abi_cxx11_
          (string *__return_storage_ptr__,Chart *this,Datetime *previous,Datetime *day)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  int month;
  bool bVar5;
  allocator<char> local_1e5 [13];
  string local_1d8;
  stringstream local_1b8 [8];
  stringstream out;
  ostream aoStack_1a8 [383];
  byte local_29;
  Datetime *pDStack_28;
  bool show_month;
  Datetime *day_local;
  Datetime *previous_local;
  Chart *this_local;
  
  pDStack_28 = day;
  day_local = previous;
  previous_local = &this->reference_datetime;
  this_local = (Chart *)__return_storage_ptr__;
  iVar1 = Datetime::month(previous);
  iVar2 = Datetime::month(pDStack_28);
  local_29 = iVar1 != iVar2;
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar5 = (local_29 & 1) == 0;
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"   ",local_1e5);
  }
  else {
    uVar3 = Datetime::month(pDStack_28);
    Datetime::monthNameShort_abi_cxx11_(&local_1d8,(Datetime *)(ulong)uVar3,month);
  }
  poVar4 = std::operator<<(aoStack_1a8,(string *)&local_1d8);
  std::operator<<(poVar4,' ');
  std::__cxx11::string::~string((string *)&local_1d8);
  if (bVar5) {
    std::allocator<char>::~allocator(local_1e5);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string Chart::renderMonth (const Datetime& previous, const Datetime& day)
{
  const auto show_month = previous.month () != day.month ();

  std::stringstream out;

  out << (show_month ? Datetime::monthNameShort (day.month ()) : "   ")
      << ' ';

  return out.str ();
}